

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

IrSim * __thiscall IrSim::commitIc(IrSim *this,C_IC *ic)

{
  bool bVar1;
  mapped_type_conflict mVar2;
  C_OP *pCVar3;
  pointer pIVar4;
  size_type sVar5;
  mapped_type_conflict *pmVar6;
  int *in_RSI;
  IrSim *in_RDI;
  reverse_iterator it;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  InterCode *in_stack_ffffffffffffff10;
  InterCode *this_00;
  IrSim *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  __type _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  key_type *in_stack_ffffffffffffff48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffff50;
  undefined1 local_20 [24];
  IrSim *local_8;
  
  local_8 = in_RDI;
  if ((*in_RSI != 0) &&
     (local_20._8_8_ = in_RSI,
     pCVar3 = InterCode::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c),
     local_8 = in_RDI, pCVar3->kind != 0)) {
    if (*(int *)local_20._8_8_ == 9) {
      std::vector<InterCode,_std::allocator<InterCode>_>::rbegin
                ((vector<InterCode,_std::allocator<InterCode>_> *)in_stack_ffffffffffffff18);
      std::vector<InterCode,_std::allocator<InterCode>_>::rend
                ((vector<InterCode,_std::allocator<InterCode>_> *)in_stack_ffffffffffffff18);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
                               *)in_stack_ffffffffffffff10,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      _Var7 = false;
      if (bVar1) {
        pIVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
                               *)in_stack_ffffffffffffff10);
        _Var7 = false;
        if (pIVar4->kind == 6) {
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
          ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
                        *)in_stack_ffffffffffffff10);
          _Var7 = std::operator==(in_stack_ffffffffffffff30,&in_RDI->tmpVarPrefix);
        }
      }
      if (_Var7 != false) {
        this_00 = (InterCode *)local_20;
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
                      *)this_00);
        icArgAddr(in_stack_ffffffffffffff18,(C_OP *)this_00);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>_>
                     *)this_00);
        InterCode::operator=
                  (this_00,(InterCode *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        InterCode::~InterCode(this_00);
        return in_RDI;
      }
      in_stack_ffffffffffffff27 = 0;
    }
    else if (*(int *)local_20._8_8_ == 0x10) {
      sVar5 = std::vector<InterCode,_std::allocator<InterCode>_>::size(&in_RDI->irList);
      mVar2 = (mapped_type_conflict)sVar5;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      *pmVar6 = mVar2;
    }
    std::vector<InterCode,_std::allocator<InterCode>_>::push_back
              ((vector<InterCode,_std::allocator<InterCode>_> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (value_type *)in_stack_ffffffffffffff18);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

IrSim &IrSim::commitIc(C_IC &ic) {
    if (!ic.kind || !ic[0].kind)
        return *this;
    if (ic.kind == IC_ARG) {
        auto it = irList.rbegin();
        if (it != irList.rend() && it->kind == IC_REF && it->target.value == ic.target.value) {
            *it = icArgAddr(it->arg1);
            return *this;
        }
    }
    else if (ic.kind == IC_LABEL) {
        labels[ic.target.value] = (int)irList.size();
    }
    irList.push_back(ic);
    return *this;
}